

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rational.hpp
# Opt level: O0

Rational<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::operator+=
          (Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *this,double x)

{
  double dVar1;
  Rational<scp::BigInt<unsigned_int,_unsigned_long>_> local_98;
  BigInt<unsigned_int,_unsigned_long> local_40;
  double local_20;
  double x_local;
  Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *this_local;
  
  local_20 = x;
  x_local = (double)this;
  dVar1 = floor(x);
  if ((dVar1 != local_20) || (NAN(dVar1) || NAN(local_20))) {
    Rational(&local_98,local_20);
    this_local = operator+=(this,&local_98);
    ~Rational(&local_98);
  }
  else {
    BigInt<unsigned_int,_unsigned_long>::BigInt(&local_40,(long)local_20);
    this_local = operator+=(this,&local_40);
    BigInt<unsigned_int,_unsigned_long>::~BigInt(&local_40);
  }
  return this_local;
}

Assistant:

constexpr Rational<TInteger>& Rational<TInteger>::operator+=(double x)
	{
		if (std::floor(x) == x)
		{
			return operator+=(TInteger(x));
		}
		else
		{
			return operator+=(Rational<TInteger>(x));
		}
	}